

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.cc
# Opt level: O0

void * raptor::Realloc(void *ptr,size_t size)

{
  size_t size_local;
  void *ptr_local;
  
  if ((size == 0) && (ptr == (void *)0x0)) {
    ptr_local = (void *)0x0;
  }
  else {
    ptr_local = realloc(ptr,size);
    if (ptr_local == (void *)0x0) {
      abort();
    }
  }
  return ptr_local;
}

Assistant:

void* Realloc(void* ptr, size_t size) {
    if ((size == 0) && (ptr == nullptr)) {
        return nullptr;
    }
    ptr = ::realloc(ptr, size);
    if (!ptr) {
        abort();
    }
    return ptr;
}